

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_flags nk_chart_push_slot(nk_context *ctx,float value,int slot)

{
  nk_chart_type nVar1;
  int iVar2;
  int iVar3;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  void *pvVar6;
  nk_flags nVar7;
  nk_flags nVar8;
  uint uVar9;
  nk_color nVar10;
  int *piVar11;
  float fVar12;
  undefined8 uVar13;
  float fVar14;
  float fVar15;
  undefined8 uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  nk_rect rect;
  nk_rect rect_00;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4efb,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4efc,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  if (3 < (uint)slot) {
    __assert_fail("slot >= 0 && slot < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4efd,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  pnVar5 = pnVar4->layout;
  if ((pnVar5->chart).slot <= slot) {
    __assert_fail("slot < ctx->current->layout->chart.slot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4efe,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  nVar1 = (pnVar5->chart).slots[(uint)slot].type;
  if (nVar1 == NK_CHART_COLUMN) {
    iVar2 = (pnVar5->chart).slots[(uint)slot].count;
    iVar3 = (pnVar5->chart).slots[(uint)slot].index;
    if (iVar2 <= iVar3) {
      return 0;
    }
    if (iVar2 == 0) {
      fVar12 = 0.0;
    }
    else {
      fVar12 = ((pnVar5->chart).w - (float)(iVar2 + -1)) / (float)iVar2;
    }
    fVar18 = (pnVar5->chart).h;
    fVar14 = (pnVar5->chart).slots[(uint)slot].range;
    fVar15 = value / fVar14;
    fVar17 = -fVar15;
    if (-fVar15 <= fVar15) {
      fVar17 = fVar15;
    }
    fVar17 = fVar17 * fVar18;
    if (0.0 <= value) {
      fVar15 = (pnVar5->chart).slots[(uint)slot].min;
      fVar19 = -fVar15;
      if (-fVar15 <= fVar15) {
        fVar19 = fVar15;
      }
      fVar15 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar15 = fVar14;
      }
      fVar18 = ((pnVar5->chart).y + fVar18) - ((fVar19 + value) / fVar15) * fVar18;
    }
    else {
      fVar14 = (value - (pnVar5->chart).slots[(uint)slot].max) / fVar14;
      fVar15 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar15 = fVar14;
      }
      fVar18 = (fVar18 * fVar15 + (pnVar5->chart).y) - fVar17;
    }
    fVar14 = (float)iVar3;
    nVar10 = (pnVar5->chart).slots[(uint)slot].color;
    uVar16 = CONCAT44(fVar17,fVar12);
    fVar14 = fVar14 * fVar12 + (pnVar5->chart).x + fVar14;
    uVar13 = CONCAT44(fVar18,fVar14);
    nVar8 = 0;
    nVar7 = 0;
    if (((((pnVar5->flags & 0x800) == 0) && (fVar15 = (ctx->input).mouse.pos.x, fVar14 <= fVar15))
        && (nVar7 = nVar8, fVar15 <= fVar12 + fVar14)) &&
       ((fVar12 = (ctx->input).mouse.pos.y, fVar18 <= fVar12 && (fVar12 <= fVar17 + fVar18)))) {
      nVar7 = 1;
      if ((ctx->input).mouse.buttons[0].down == 0) {
        nVar7 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2 + 1;
      }
      nVar10 = (pnVar5->chart).slots[(uint)slot].highlight;
    }
    piVar11 = &(pnVar5->chart).slots[(uint)slot].index;
  }
  else {
    if (nVar1 != NK_CHART_LINES) {
      return 0;
    }
    fVar12 = (pnVar5->chart).slots[(uint)slot].min;
    fVar12 = (value - fVar12) / ((pnVar5->chart).slots[(uint)slot].max - fVar12);
    piVar11 = &(pnVar5->chart).slots[(uint)slot].index;
    if (*piVar11 != 0) {
      fVar17 = (float)*piVar11 *
               ((pnVar5->chart).w / (float)(pnVar5->chart).slots[(uint)slot].count) +
               (pnVar5->chart).x;
      fVar18 = (pnVar5->chart).h;
      nVar10 = (pnVar5->chart).slots[(uint)slot].color;
      fVar14 = (fVar18 + (pnVar5->chart).y) - fVar12 * fVar18;
      fVar12 = (pnVar5->chart).slots[(uint)slot].last.x;
      fVar18 = (pnVar5->chart).slots[(uint)slot].last.y;
      pvVar6 = nk_command_buffer_push(&pnVar4->buffer,NK_COMMAND_LINE,0x20);
      if (pvVar6 != (void *)0x0) {
        *(undefined2 *)((long)pvVar6 + 0x10) = 1;
        *(short *)((long)pvVar6 + 0x12) = (short)(int)fVar12;
        *(short *)((long)pvVar6 + 0x14) = (short)(int)fVar18;
        *(short *)((long)pvVar6 + 0x16) = (short)(int)fVar17;
        *(short *)((long)pvVar6 + 0x18) = (short)(int)fVar14;
        *(nk_color *)((long)pvVar6 + 0x1a) = nVar10;
      }
      nVar8 = 0;
      nVar7 = 0;
      if ((pnVar5->flags & 0x800) == 0) {
        fVar12 = (ctx->input).mouse.pos.x;
        nVar7 = nVar8;
        if ((fVar17 + -3.0 <= fVar12) && (fVar12 <= fVar17 + -3.0 + 6.0)) {
          fVar12 = (ctx->input).mouse.pos.y;
          if ((fVar14 + -3.0 <= fVar12) && (fVar12 <= fVar14 + -3.0 + 6.0)) {
            nVar7 = 1;
            if ((ctx->input).mouse.buttons[0].down == 0) {
              nVar7 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2 + 1;
            }
            nVar10 = (pnVar5->chart).slots[(uint)slot].highlight;
          }
        }
      }
      rect.x = fVar17 + -2.0;
      rect.y = fVar14 + -2.0;
      rect.w = 4.0;
      rect.h = 4.0;
      nk_fill_rect(&pnVar4->buffer,rect,0.0,nVar10);
      (pnVar5->chart).slots[(uint)slot].last.x = fVar17;
      (pnVar5->chart).slots[(uint)slot].last.y = fVar14;
      goto LAB_0013680c;
    }
    fVar18 = (pnVar5->chart).x;
    (pnVar5->chart).slots[(uint)slot].last.x = fVar18;
    fVar14 = (pnVar5->chart).h;
    fVar17 = ((pnVar5->chart).y + fVar14) - fVar12 * fVar14;
    (pnVar5->chart).slots[(uint)slot].last.y = fVar17;
    fVar14 = fVar18 + -2.0;
    fVar12 = fVar17 + -2.0;
    uVar13 = CONCAT44(fVar12,fVar14);
    nVar10 = (pnVar5->chart).slots[(uint)slot].color;
    nVar8 = 0;
    nVar7 = 0;
    if ((pnVar5->flags & 0x800) == 0) {
      fVar15 = (ctx->input).mouse.pos.x;
      if ((fVar18 + -3.0 <= fVar15) && (nVar7 = nVar8, fVar15 <= fVar18 + -3.0 + 6.0)) {
        fVar18 = (ctx->input).mouse.pos.y;
        if ((fVar17 + -3.0 <= fVar18) && (fVar18 <= fVar17 + -3.0 + 6.0)) {
          if ((ctx->input).mouse.buttons[0].down == 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2;
          }
          nVar7 = uVar9 | -(uint)((fVar15 <= fVar14 + 4.0 && fVar14 <= fVar15) &&
                                 (fVar12 <= fVar18 && fVar18 <= fVar12 + 4.0)) & 1;
          nVar10 = (pnVar5->chart).slots[(uint)slot].highlight;
        }
      }
    }
    uVar16 = 0x4080000040800000;
  }
  rect_00.w = (float)(int)uVar16;
  rect_00.h = (float)(int)((ulong)uVar16 >> 0x20);
  rect_00.x = (float)(int)uVar13;
  rect_00.y = (float)(int)((ulong)uVar13 >> 0x20);
  nk_fill_rect(&pnVar4->buffer,rect_00,0.0,nVar10);
LAB_0013680c:
  *piVar11 = *piVar11 + 1;
  return nVar7;
}

Assistant:

NK_API nk_flags
nk_chart_push_slot(struct nk_context *ctx, float value, int slot)
{
    nk_flags flags;
    struct nk_window *win;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(slot >= 0 && slot < NK_CHART_MAX_SLOT);
    NK_ASSERT(slot < ctx->current->layout->chart.slot);
    if (!ctx || !ctx->current || slot >= NK_CHART_MAX_SLOT) return nk_false;
    if (slot >= ctx->current->layout->chart.slot) return nk_false;

    win = ctx->current;
    if (win->layout->chart.slot < slot) return nk_false;
    switch (win->layout->chart.slots[slot].type) {
    case NK_CHART_LINES:
        flags = nk_chart_push_line(ctx, win, &win->layout->chart, value, slot); break;
    case NK_CHART_COLUMN:
        flags = nk_chart_push_column(ctx, win, &win->layout->chart, value, slot); break;
    default:
    case NK_CHART_MAX:
        flags = 0;
    }
    return flags;
}